

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomdiscard(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  expr *peVar4;
  expr **ppeVar5;
  
  if (ctx->reverse == 0) {
    peVar4 = (expr *)calloc(0x48,1);
    peVar4->type = EXPR_DISCARD;
    iVar1 = ctx->atomsmax;
    if (iVar1 <= ctx->atomsnum) {
      iVar2 = 0x10;
      if (iVar1 != 0) {
        iVar2 = iVar1 * 2;
      }
      ctx->atomsmax = iVar2;
      ppeVar5 = (expr **)realloc(ctx->atoms,(long)iVar2 << 3);
      ctx->atoms = ppeVar5;
    }
    iVar1 = ctx->atomsnum;
    ctx->atomsnum = iVar1 + 1;
    ctx->atoms[iVar1] = peVar4;
  }
  else if ((ctx->line->atomsnum != spos) && (ctx->line->atoms[spos]->type == EXPR_DISCARD)) {
    pmVar3 = alwaysmatches(spos + 1);
    return pmVar3;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomdiscard APROTO {
	if (ctx->reverse) {
		if (spos == ctx->line->atomsnum)
			return 0;
		if (ctx->line->atoms[spos]->type == EXPR_DISCARD) {
			return alwaysmatches(spos+1);
		} else {
			return 0;
		}
	}
	struct expr *expr = makeex(EXPR_DISCARD);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}